

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc,secp256k1_ge *pt,size_t idx,void *data)

{
  int iVar1;
  secp256k1_context *in_RCX;
  int ret;
  secp256k1_musig_pubkey_agg_ecmult_data *ctx;
  secp256k1_ge *in_stack_00000068;
  secp256k1_ge *in_stack_00000070;
  uchar *in_stack_00000078;
  secp256k1_scalar *in_stack_00000080;
  secp256k1_pubkey *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = secp256k1_pubkey_load
                    (in_RCX,(secp256k1_ge *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/keyagg_impl.h"
            ,0xa7,"test condition failed: ret");
    abort();
  }
  secp256k1_musig_keyaggcoef_internal
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
  return 1;
}

Assistant:

static int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc, secp256k1_ge *pt, size_t idx, void *data) {
    secp256k1_musig_pubkey_agg_ecmult_data *ctx = (secp256k1_musig_pubkey_agg_ecmult_data *) data;
    int ret;
    ret = secp256k1_pubkey_load(ctx->ctx, pt, ctx->pks[idx]);
#ifdef VERIFY
    /* pubkey_load can't fail because the same pks have already been loaded in
     * `musig_compute_pks_hash` (and we test this). */
    VERIFY_CHECK(ret);
#else
    (void) ret;
#endif
    secp256k1_musig_keyaggcoef_internal(sc, ctx->pks_hash, pt, &ctx->second_pk);
    return 1;
}